

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_auth_client.c
# Opt level: O2

CREDENTIAL_RESULT *
iothub_device_auth_generate_credentials
          (IOTHUB_SECURITY_HANDLE handle,DEVICE_AUTH_CREDENTIAL_INFO *dev_auth_cred)

{
  char **destination;
  char cVar1;
  int iVar2;
  HMACSHA256_RESULT HVar3;
  LOGGER_LOG p_Var4;
  size_t sVar5;
  size_t sVar6;
  uchar *payload;
  BUFFER_HANDLE handle_00;
  BUFFER_HANDLE hash;
  uchar *puVar7;
  STRING_HANDLE input;
  STRING_HANDLE handle_01;
  STRING_HANDLE handle_02;
  char *pcVar8;
  char *pcVar9;
  STRING_HANDLE handle_03;
  CREDENTIAL_RESULT *pCVar10;
  char *pcVar11;
  char *local_98;
  uchar *data_value;
  size_t data_len;
  size_t local_80;
  char expire_token [64];
  
  if (handle == (IOTHUB_SECURITY_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (CREDENTIAL_RESULT *)0x0;
    }
    pcVar11 = "Invalid handle parameter: handle";
    iVar2 = 0x114;
LAB_001435f3:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
              ,"iothub_device_auth_generate_credentials",iVar2,1,pcVar11);
    return (CREDENTIAL_RESULT *)0x0;
  }
  if ((handle->cred_type | AUTH_TYPE_X509) != AUTH_TYPE_SYMM_KEY) {
    if (handle->x509_certificate != (char *)0x0) {
      free(handle->x509_certificate);
      handle->x509_certificate = (char *)0x0;
    }
    if (handle->x509_alias_key != (char *)0x0) {
      free(handle->x509_alias_key);
      handle->x509_alias_key = (char *)0x0;
    }
    pCVar10 = (CREDENTIAL_RESULT *)malloc(0x18);
    if (pCVar10 != (CREDENTIAL_RESULT *)0x0) {
      pcVar11 = (*handle->hsm_client_get_cert)(handle->hsm_client_handle);
      handle->x509_certificate = pcVar11;
      if (pcVar11 == (char *)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                    ,"iothub_device_auth_generate_credentials",0x1b7,1,
                    "Failure allocating device credential result.");
        }
      }
      else {
        pcVar11 = (*handle->hsm_client_get_alias_key)(handle->hsm_client_handle);
        handle->x509_alias_key = pcVar11;
        if (pcVar11 != (char *)0x0) {
          (pCVar10->auth_cred_result).sas_result.sas_token = handle->x509_certificate;
          (pCVar10->auth_cred_result).x509_result.x509_alias_key = pcVar11;
          return pCVar10;
        }
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                    ,"iothub_device_auth_generate_credentials",0x1bd,1,
                    "Failure allocating device credential result.");
        }
        free(handle->x509_certificate);
        handle->x509_certificate = (char *)0x0;
      }
      free(pCVar10);
      return (CREDENTIAL_RESULT *)0x0;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (CREDENTIAL_RESULT *)0x0;
    }
    pcVar11 = "Failure allocating credential result.";
    iVar2 = 0x1b3;
    goto LAB_001435f3;
  }
  expire_token[0x30] = '\0';
  expire_token[0x31] = '\0';
  expire_token[0x32] = '\0';
  expire_token[0x33] = '\0';
  expire_token[0x34] = '\0';
  expire_token[0x35] = '\0';
  expire_token[0x36] = '\0';
  expire_token[0x37] = '\0';
  expire_token[0x38] = '\0';
  expire_token[0x39] = '\0';
  expire_token[0x3a] = '\0';
  expire_token[0x3b] = '\0';
  expire_token[0x3c] = '\0';
  expire_token[0x3d] = '\0';
  expire_token[0x3e] = '\0';
  expire_token[0x3f] = '\0';
  expire_token[0x20] = '\0';
  expire_token[0x21] = '\0';
  expire_token[0x22] = '\0';
  expire_token[0x23] = '\0';
  expire_token[0x24] = '\0';
  expire_token[0x25] = '\0';
  expire_token[0x26] = '\0';
  expire_token[0x27] = '\0';
  expire_token[0x28] = '\0';
  expire_token[0x29] = '\0';
  expire_token[0x2a] = '\0';
  expire_token[0x2b] = '\0';
  expire_token[0x2c] = '\0';
  expire_token[0x2d] = '\0';
  expire_token[0x2e] = '\0';
  expire_token[0x2f] = '\0';
  expire_token[0x10] = '\0';
  expire_token[0x11] = '\0';
  expire_token[0x12] = '\0';
  expire_token[0x13] = '\0';
  expire_token[0x14] = '\0';
  expire_token[0x15] = '\0';
  expire_token[0x16] = '\0';
  expire_token[0x17] = '\0';
  expire_token[0x18] = '\0';
  expire_token[0x19] = '\0';
  expire_token[0x1a] = '\0';
  expire_token[0x1b] = '\0';
  expire_token[0x1c] = '\0';
  expire_token[0x1d] = '\0';
  expire_token[0x1e] = '\0';
  expire_token[0x1f] = '\0';
  expire_token[0] = '\0';
  expire_token[1] = '\0';
  expire_token[2] = '\0';
  expire_token[3] = '\0';
  expire_token[4] = '\0';
  expire_token[5] = '\0';
  expire_token[6] = '\0';
  expire_token[7] = '\0';
  expire_token[8] = '\0';
  expire_token[9] = '\0';
  expire_token[10] = '\0';
  expire_token[0xb] = '\0';
  expire_token[0xc] = '\0';
  expire_token[0xd] = '\0';
  expire_token[0xe] = '\0';
  expire_token[0xf] = '\0';
  destination = &handle->sas_token;
  if (handle->sas_token != (char *)0x0) {
    free(handle->sas_token);
    *destination = (char *)0x0;
  }
  if ((dev_auth_cred == (DEVICE_AUTH_CREDENTIAL_INFO *)0x0) ||
     ((dev_auth_cred->sas_info).token_scope == (char *)0x0)) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (CREDENTIAL_RESULT *)0x0;
    }
    pcVar11 = "Invalid handle parameter: dev_auth_cred";
    iVar2 = 0x123;
    goto LAB_001435f3;
  }
  if ((dev_auth_cred->dev_auth_type | AUTH_TYPE_X509) != AUTH_TYPE_SYMM_KEY) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (CREDENTIAL_RESULT *)0x0;
    }
    pcVar11 = "Invalid handle parameter: dev_auth_cred.dev_auth_type";
    iVar2 = 0x128;
    goto LAB_001435f3;
  }
  iVar2 = size_tToString(expire_token,0x40,(dev_auth_cred->sas_info).expiry_seconds);
  if (iVar2 != 0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (CREDENTIAL_RESULT *)0x0;
    }
    pcVar11 = "Failure creating expire token";
    iVar2 = 0x12e;
    goto LAB_001435f3;
  }
  pcVar11 = (dev_auth_cred->sas_info).token_scope;
  sVar5 = strlen(pcVar11);
  sVar6 = strlen(expire_token);
  payload = (uchar *)malloc(sVar5 + sVar6 + 4);
  if (payload == (uchar *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (CREDENTIAL_RESULT *)0x0;
    }
    pcVar11 = "Failure allocating payload.";
    iVar2 = 0x137;
    goto LAB_001435f3;
  }
  iVar2 = sprintf((char *)payload,"%s\n%s",pcVar11,expire_token);
  if (iVar2 == 0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00143a34;
    pcVar11 = "Failure constructing hash payload.";
    iVar2 = 0x142;
  }
  else {
    sVar5 = strlen((char *)payload);
    if (handle->cred_type == AUTH_TYPE_SAS) {
      iVar2 = (*handle->hsm_client_sign_data)
                        (handle->hsm_client_handle,payload,sVar5,&data_value,&data_len);
      if (iVar2 == 0) {
LAB_00143727:
        if (handle->base64_encode_signature == true) {
          input = Azure_Base64_Encode_Bytes(data_value,data_len);
        }
        else {
          input = STRING_construct((char *)data_value);
        }
        if (input == (STRING_HANDLE)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_001438f9;
          pCVar10 = (CREDENTIAL_RESULT *)0x0;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                    ,"iothub_device_auth_generate_credentials",0x154,1,
                    "Failure constructing encoding.");
        }
        else {
          handle_01 = URL_Encode(input);
          if (handle_01 == (STRING_HANDLE)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                        ,"iothub_device_auth_generate_credentials",0x159,1,
                        "Failure constructing url Signature.");
            }
            STRING_delete(input);
LAB_001438f9:
            pCVar10 = (CREDENTIAL_RESULT *)0x0;
          }
          else {
            pcVar11 = (dev_auth_cred->sas_info).key_name;
            if (pcVar11 == (char *)0x0) {
              pcVar11 = "";
              local_98 = "";
            }
            else {
              cVar1 = *pcVar11;
              if (cVar1 == '\0') {
                pcVar11 = "";
              }
              local_98 = "&skn=";
              if (cVar1 == '\0') {
                local_98 = "";
              }
            }
            pcVar8 = (dev_auth_cred->sas_info).token_scope;
            if (handle->urlencode_token_scope == true) {
              handle_02 = URL_EncodeString(pcVar8);
              if (handle_02 == (STRING_HANDLE)0x0) {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 == (LOGGER_LOG)0x0) {
                  handle_03 = (STRING_HANDLE)0x0;
                }
                else {
                  handle_03 = (STRING_HANDLE)0x0;
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                            ,"iothub_device_auth_generate_credentials",0x16f,1,
                            "failed to url string %s",(dev_auth_cred->sas_info).token_scope);
                }
              }
              else {
                pcVar8 = STRING_c_str(handle_02);
                pcVar9 = STRING_c_str(handle_01);
                handle_03 = STRING_construct_sprintf
                                      ("SharedAccessSignature sr=%s&sig=%s&se=%s%s%s",pcVar8,pcVar9,
                                       expire_token,local_98,pcVar11);
              }
              STRING_delete(handle_02);
            }
            else {
              pcVar9 = STRING_c_str(handle_01);
              handle_03 = STRING_construct_sprintf
                                    ("SharedAccessSignature sr=%s&sig=%s&se=%s%s%s",pcVar8,pcVar9,
                                     expire_token,local_98,pcVar11);
            }
            if (handle_03 == (STRING_HANDLE)0x0) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                pcVar11 = "Failure constructing url Signature.";
                iVar2 = 0x180;
                goto LAB_00143b72;
              }
LAB_00143b79:
              pCVar10 = (CREDENTIAL_RESULT *)0x0;
            }
            else {
              pCVar10 = (CREDENTIAL_RESULT *)malloc(0x18);
              if (pCVar10 == (CREDENTIAL_RESULT *)0x0) {
                STRING_delete(handle_03);
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00143b79;
                pcVar11 = "Failure allocating credential result.";
                iVar2 = 0x185;
LAB_00143b72:
                pCVar10 = (CREDENTIAL_RESULT *)0x0;
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                          ,"iothub_device_auth_generate_credentials",iVar2,1,pcVar11);
              }
              else {
                pcVar11 = STRING_c_str(handle_03);
                iVar2 = mallocAndStrcpy_s(destination,pcVar11);
                if (iVar2 == 0) {
                  (pCVar10->auth_cred_result).x509_result.x509_cert = *destination;
                }
                else {
                  free(pCVar10);
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 == (LOGGER_LOG)0x0) {
                    pCVar10 = (CREDENTIAL_RESULT *)0x0;
                  }
                  else {
                    pCVar10 = (CREDENTIAL_RESULT *)0x0;
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                              ,"iothub_device_auth_generate_credentials",0x18e,1,
                              "Failure allocating and copying string.");
                  }
                }
                STRING_delete(handle_03);
              }
            }
            STRING_delete(input);
            STRING_delete(handle_01);
          }
        }
        free(data_value);
        goto LAB_00143bae;
      }
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar11 = "Failed signing data";
        iVar2 = 0x39;
LAB_00143768:
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                  ,"sign_sas_data",iVar2,1,pcVar11);
      }
    }
    else {
      pcVar11 = (*handle->hsm_client_get_symm_key)(handle->hsm_client_handle);
      if (pcVar11 == (char *)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar11 = "Failed getting asymmetrical key";
          iVar2 = 0x46;
          goto LAB_00143768;
        }
      }
      else {
        handle_00 = Azure_Base64_Decode(pcVar11);
        if (handle_00 == (BUFFER_HANDLE)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                      ,"sign_sas_data",0x50,1,"Failed decoding symmetrical key");
          }
        }
        else {
          hash = BUFFER_new();
          if (hash == (BUFFER_HANDLE)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                        ,"sign_sas_data",0x55,1,"Failed allocating output hash buffer");
            }
            BUFFER_delete(handle_00);
          }
          else {
            local_80 = BUFFER_length(handle_00);
            puVar7 = BUFFER_u_char(handle_00);
            HVar3 = HMACSHA256_ComputeHash(puVar7,local_80,payload,sVar5,hash);
            if (HVar3 == HMACSHA256_OK) {
              data_len = BUFFER_length(hash);
              data_value = (uchar *)malloc(data_len);
              if (data_value != (uchar *)0x0) {
                puVar7 = BUFFER_u_char(hash);
                memcpy(data_value,puVar7,data_len);
                BUFFER_delete(handle_00);
                BUFFER_delete(hash);
                free(pcVar11);
                goto LAB_00143727;
              }
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                pcVar8 = "Failed allocating output buffer";
                iVar2 = 0x67;
                goto LAB_001439d4;
              }
            }
            else {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                pcVar8 = "Failed computing HMAC Hash";
                iVar2 = 0x5f;
LAB_001439d4:
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                          ,"sign_sas_data",iVar2,1,pcVar8);
              }
            }
            BUFFER_delete(handle_00);
            BUFFER_delete(hash);
          }
        }
        free(pcVar11);
      }
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
LAB_00143a34:
      pCVar10 = (CREDENTIAL_RESULT *)0x0;
      goto LAB_00143bae;
    }
    pcVar11 = "Failure generate hash from tpm.";
    iVar2 = 0x19e;
  }
  pCVar10 = (CREDENTIAL_RESULT *)0x0;
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
            ,"iothub_device_auth_generate_credentials",iVar2,1,pcVar11);
LAB_00143bae:
  free(payload);
  return pCVar10;
}

Assistant:

CREDENTIAL_RESULT* iothub_device_auth_generate_credentials(IOTHUB_SECURITY_HANDLE handle, const DEVICE_AUTH_CREDENTIAL_INFO* dev_auth_cred)
{
    CREDENTIAL_RESULT* result;
    if (handle == NULL)
    {
        LogError("Invalid handle parameter: handle");
        result = NULL;
    }
    else
    {
        if (handle->cred_type == AUTH_TYPE_SAS || handle->cred_type == AUTH_TYPE_SYMM_KEY)
        {
            char expire_token[64] = { 0 };
            if (handle->sas_token != NULL)
            {
                free(handle->sas_token);
                handle->sas_token = NULL;
            }
            if (dev_auth_cred == NULL || dev_auth_cred->sas_info.token_scope == NULL)
            {
                LogError("Invalid handle parameter: dev_auth_cred");
                result = NULL;
            }
            else if (dev_auth_cred->dev_auth_type != AUTH_TYPE_SAS && dev_auth_cred->dev_auth_type != AUTH_TYPE_SYMM_KEY)
            {
                LogError("Invalid handle parameter: dev_auth_cred.dev_auth_type");
                result = NULL;
            }
            else if (size_tToString(expire_token, sizeof(expire_token), (size_t)dev_auth_cred->sas_info.expiry_seconds) != 0)
            {
                result = NULL;
                LogError("Failure creating expire token");
            }
            else
            {
                size_t len = strlen(dev_auth_cred->sas_info.token_scope)+strlen(expire_token)+3;
                char* payload = malloc(len+1);
                if (payload == NULL)
                {
                    result = NULL;
                    LogError("Failure allocating payload.");
                }
                else
                {
                    unsigned char* data_value;
                    size_t data_len;

                    size_t total_len = sprintf(payload, "%s\n%s", dev_auth_cred->sas_info.token_scope, expire_token);
                    if (total_len <= 0)
                    {
                        result = NULL;
                        LogError("Failure constructing hash payload.");
                    }
                    else if (sign_sas_data(handle, payload, &data_value, &data_len) == 0)
                    {
                        STRING_HANDLE urlEncodedSignature = NULL;
                        STRING_HANDLE signature = NULL;
                        if (handle->base64_encode_signature == true)
                        {
                            signature = Azure_Base64_Encode_Bytes(data_value, data_len);
                        }
                        else
                        {
                            signature = STRING_construct((const char*)data_value);
                        }

                        if (signature == NULL)
                        {
                            result = NULL;
                            LogError("Failure constructing encoding.");
                        }
                        else if ((urlEncodedSignature = URL_Encode(signature)) == NULL)
                        {
                            result = NULL;
                            LogError("Failure constructing url Signature.");
                            STRING_delete(signature);
                        }
                        else
                        {
                            const char* skn_key = "";
                            const char* skn_value = "";

                            if ((dev_auth_cred->sas_info.key_name != NULL) && (strlen(dev_auth_cred->sas_info.key_name) > 0))
                            {
                                // If the key name is valid then add to the sas token
                                skn_key = SKN_SECTION_FORMAT;
                                skn_value = dev_auth_cred->sas_info.key_name;
                            }

                            STRING_HANDLE sas_token_handle = NULL;

                            if (handle->urlencode_token_scope == true)
                            {
                                STRING_HANDLE url_encoded = URL_EncodeString(dev_auth_cred->sas_info.token_scope);
                                if (url_encoded == NULL)
                                {
                                    LogError("failed to url string %s", dev_auth_cred->sas_info.token_scope);
                                }
                                else
                                {
                                    sas_token_handle = STRING_construct_sprintf(SAS_TOKEN_FORMAT, STRING_c_str(url_encoded), STRING_c_str(urlEncodedSignature), expire_token, skn_key, skn_value);
                                }

                                STRING_delete(url_encoded);
                            }
                            else
                            {
                                sas_token_handle = STRING_construct_sprintf(SAS_TOKEN_FORMAT, dev_auth_cred->sas_info.token_scope, STRING_c_str(urlEncodedSignature), expire_token, skn_key, skn_value);
                            }

                            if (sas_token_handle == NULL)
                            {
                                result = NULL;
                                LogError("Failure constructing url Signature.");
                            }
                            else if ((result = malloc(sizeof(CREDENTIAL_RESULT))) == NULL)
                            {
                                STRING_delete(sas_token_handle);
                                LogError("Failure allocating credential result.");
                            }
                            else
                            {
                                const char* temp_sas_token = STRING_c_str(sas_token_handle);
                                if (mallocAndStrcpy_s(&handle->sas_token, temp_sas_token) != 0)
                                {
                                    free(result);
                                    result = NULL;
                                    LogError("Failure allocating and copying string.");
                                }
                                else
                                {
                                    result->auth_cred_result.sas_result.sas_token = handle->sas_token;
                                }
                                STRING_delete(sas_token_handle);
                            }
                            STRING_delete(signature);
                            STRING_delete(urlEncodedSignature);
                        }
                        free(data_value);
                    }
                    else
                    {
                        result = NULL;
                        LogError("Failure generate hash from tpm.");
                    }
                    free(payload);
                }
            }
        }
        else
        {
            if (handle->x509_certificate != NULL)
            {
                free(handle->x509_certificate);
                handle->x509_certificate = NULL;
            }
            if (handle->x509_alias_key != NULL)
            {
                free(handle->x509_alias_key);
                handle->x509_alias_key = NULL;
            }

            if ((result = malloc(sizeof(CREDENTIAL_RESULT))) == NULL)
            {
                LogError("Failure allocating credential result.");
            }
            else if ((handle->x509_certificate = handle->hsm_client_get_cert(handle->hsm_client_handle)) == NULL)
            {
                LogError("Failure allocating device credential result.");
                free(result);
                result = NULL;
            }
            else if ((handle->x509_alias_key = handle->hsm_client_get_alias_key(handle->hsm_client_handle)) == NULL)
            {
                LogError("Failure allocating device credential result.");
                free(handle->x509_certificate);
                handle->x509_certificate = NULL;
                free(result);
                result = NULL;
            }
            else
            {
                result->auth_cred_result.x509_result.x509_cert = handle->x509_certificate;
                result->auth_cred_result.x509_result.x509_alias_key = handle->x509_alias_key;
            }
        }
    }
    return result;
}